

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int ClampBits(int width,int height,int bits,int min_bits,int max_bits,int image_size_max)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  uint32_t in_EDI;
  uint32_t in_R8D;
  int in_R9D;
  int image_size;
  uint32_t local_24;
  uint32_t local_20;
  int local_1c;
  uint32_t local_c;
  
  local_20 = in_ECX;
  if ((int)in_ECX <= (int)in_EDX) {
    local_24 = in_EDX;
    if ((int)in_R8D < (int)in_EDX) {
      local_24 = in_R8D;
    }
    local_20 = local_24;
  }
  local_c = local_20;
  uVar1 = VP8LSubSampleSize(in_EDI,local_20);
  uVar2 = VP8LSubSampleSize(in_ESI,local_20);
  local_1c = uVar1 * uVar2;
  while ((int)local_c < (int)in_R8D && in_R9D < local_1c) {
    local_c = local_c + 1;
    uVar1 = VP8LSubSampleSize(in_EDI,local_c);
    uVar2 = VP8LSubSampleSize(in_ESI,local_c);
    local_1c = uVar1 * uVar2;
  }
  while( true ) {
    if ((int)local_c <= (int)in_ECX || local_1c != 1) {
      return local_c;
    }
    uVar1 = VP8LSubSampleSize(in_EDI,local_c - 1);
    uVar2 = VP8LSubSampleSize(in_ESI,local_c - 1);
    if (uVar1 * uVar2 != 1) break;
    local_c = local_c - 1;
    local_1c = 1;
  }
  return local_c;
}

Assistant:

static int ClampBits(int width, int height, int bits, int min_bits,
                     int max_bits, int image_size_max) {
  int image_size;
  bits = (bits < min_bits) ? min_bits : (bits > max_bits) ? max_bits : bits;
  image_size = VP8LSubSampleSize(width, bits) * VP8LSubSampleSize(height, bits);
  while (bits < max_bits && image_size > image_size_max) {
    ++bits;
    image_size =
        VP8LSubSampleSize(width, bits) * VP8LSubSampleSize(height, bits);
  }
  // In case the bits reduce the image too much, choose the smallest value
  // setting the histogram image size to 1.
  while (bits > min_bits && image_size == 1) {
    image_size = VP8LSubSampleSize(width, bits - 1) *
                 VP8LSubSampleSize(height, bits - 1);
    if (image_size != 1) break;
    --bits;
  }
  return bits;
}